

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O3

uint __thiscall crnlib::symbol_codec::decode_truncated_binary(symbol_codec *this,uint n)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar2 = 0;
  if (1 < n) {
    uVar2 = 0;
    uVar3 = n;
    do {
      uVar2 = uVar2 + 1;
      bVar1 = 3 < uVar3;
      uVar3 = uVar3 >> 1;
    } while (bVar1);
  }
  uVar4 = (1 << ((char)uVar2 + 1U & 0x1f)) - n;
  uVar2 = decode_bits(this,uVar2);
  if (uVar4 <= uVar2) {
    uVar3 = get_bits(this,1);
    uVar2 = (uVar3 | uVar2 * 2) - uVar4;
  }
  return uVar2;
}

Assistant:

uint symbol_codec::decode_truncated_binary(uint n)
    {
        CRNLIB_ASSERT(n >= 2);

        uint k = math::floor_log2i(n);
        uint u = (1 << (k + 1)) - n;

        uint i = decode_bits(k);

        if (i >= u)
        {
            i = ((i << 1) | decode_bits(1)) - u;
        }

        return i;
    }